

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp.cpp
# Opt level: O0

int lzham::lzham_lib_z_deflateReset(lzham_z_streamp pStream)

{
  lzham_compress_state_ptr pvVar1;
  long in_RDI;
  lzham_compress_state_ptr pComp;
  undefined4 local_4;
  
  if (in_RDI == 0) {
    local_4 = -2;
  }
  else if (*(lzham_compress_state_ptr *)(in_RDI + 0x38) == (lzham_compress_state_ptr)0x0) {
    local_4 = -2;
  }
  else {
    pvVar1 = lzham_lib_compress_reinit(*(lzham_compress_state_ptr *)(in_RDI + 0x38));
    if (pvVar1 == (lzham_compress_state_ptr)0x0) {
      local_4 = -2;
    }
    else {
      *(lzham_compress_state_ptr *)(in_RDI + 0x38) = pvVar1;
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int lzham_lib_z_deflateReset(lzham_z_streamp pStream)
   {
      if (!pStream)
      {
         LZHAM_LOG_ERROR(6034);
         return LZHAM_Z_STREAM_ERROR;
      }

      lzham_compress_state_ptr pComp = (lzham_compress_state_ptr)pStream->state;
      if (!pComp)
      {
         LZHAM_LOG_ERROR(6035);
         return LZHAM_Z_STREAM_ERROR;
      }

      pComp = lzham_lib_compress_reinit(pComp);
      if (!pComp)
      {
         LZHAM_LOG_ERROR(6036);
         return LZHAM_Z_STREAM_ERROR;
      }

      pStream->state = (struct lzham_z_internal_state *)pComp;

      return LZHAM_Z_OK;
   }